

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_init.c
# Opt level: O0

Atom getAtomIfSupported(Atom *supportedAtoms,unsigned_long atomCount,char *atomName)

{
  Atom AVar1;
  ulong local_38;
  unsigned_long i;
  Atom atom;
  char *atomName_local;
  unsigned_long atomCount_local;
  Atom *supportedAtoms_local;
  
  AVar1 = (*_glfw.x11.xlib.InternAtom)(_glfw.x11.display,atomName,0);
  local_38 = 0;
  while( true ) {
    if (atomCount <= local_38) {
      return 0;
    }
    if (supportedAtoms[local_38] == AVar1) break;
    local_38 = local_38 + 1;
  }
  return AVar1;
}

Assistant:

static Atom getAtomIfSupported(Atom* supportedAtoms,
                               unsigned long atomCount,
                               const char* atomName)
{
    const Atom atom = XInternAtom(_glfw.x11.display, atomName, False);

    for (unsigned long i = 0;  i < atomCount;  i++)
    {
        if (supportedAtoms[i] == atom)
            return atom;
    }

    return None;
}